

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_DReg8_Data8(VGMPlayer *this)

{
  UINT8 UVar1;
  CHIP_DEVICE *pCVar2;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    UVar1 = this->_fileData[(ulong)this->_filePos + 2];
    (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,'\0',
                      this->_fileData[(ulong)this->_filePos + 1] & 0x7f);
    (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,'\x01',UVar1);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DReg8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	SendYMCommand(cDev, 0, fData[0x01] & 0x7F, fData[0x02]);
	return;
}